

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_helper.c
# Opt level: O1

int arg_parse_enum_helper(arg *arg,char *err_msg)

{
  char *__s1;
  arg_enum_list *paVar1;
  char *pcVar2;
  int iVar3;
  char *in_RAX;
  ulong uVar4;
  char *endptr;
  char *local_28;
  
  if (err_msg != (char *)0x0) {
    *err_msg = '\0';
  }
  local_28 = in_RAX;
  uVar4 = strtol(arg->val,&local_28,10);
  __s1 = arg->val;
  if ((*__s1 != '\0') && (*local_28 == '\0')) {
    paVar1 = arg->def->enums;
    pcVar2 = paVar1->name;
    while (pcVar2 != (char *)0x0) {
      if (uVar4 == (long)paVar1->val) goto LAB_0011ed7d;
      pcVar2 = paVar1[1].name;
      paVar1 = paVar1 + 1;
    }
  }
  paVar1 = arg->def->enums;
  pcVar2 = paVar1->name;
  do {
    if (pcVar2 == (char *)0x0) {
      if (err_msg == (char *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        snprintf(err_msg,200,"Option %s: Invalid value \'%s\'\n",arg->name,__s1);
      }
LAB_0011ed7d:
      return (int)uVar4;
    }
    iVar3 = strcmp(__s1,pcVar2);
    if (iVar3 == 0) {
      uVar4 = (ulong)(uint)paVar1->val;
      goto LAB_0011ed7d;
    }
    pcVar2 = paVar1[1].name;
    paVar1 = paVar1 + 1;
  } while( true );
}

Assistant:

int arg_parse_enum_helper(const struct arg *arg, char *err_msg) {
  const struct arg_enum_list *listptr;
  long rawval;  // NOLINT
  char *endptr;

  if (err_msg) err_msg[0] = '\0';

  /* First see if the value can be parsed as a raw value */
  rawval = strtol(arg->val, &endptr, 10);
  if (arg->val[0] != '\0' && endptr[0] == '\0') {
    /* Got a raw value, make sure it's valid */
    for (listptr = arg->def->enums; listptr->name; listptr++)
      if (listptr->val == rawval) return (int)rawval;
  }

  /* Next see if it can be parsed as a string */
  for (listptr = arg->def->enums; listptr->name; listptr++)
    if (!strcmp(arg->val, listptr->name)) return listptr->val;

  SET_ERR_STRING("Option %s: Invalid value '%s'\n", arg->name, arg->val);
  return 0;
}